

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Err.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1a3f9e::DefaultErrStreamBuf::sync(DefaultErrStreamBuf *this)

{
  long lVar1;
  long lVar2;
  void *__ptr;
  char *pcVar3;
  size_t size;
  
  lVar1 = std::streambuf::pbase();
  lVar2 = std::streambuf::pptr();
  if (lVar1 != lVar2) {
    lVar1 = std::streambuf::pptr();
    lVar2 = std::streambuf::pbase();
    __ptr = (void *)std::streambuf::pbase();
    fwrite(__ptr,1,lVar1 - lVar2,_stderr);
    pcVar3 = (char *)std::streambuf::pbase();
    std::streambuf::epptr();
    std::streambuf::setp((char *)this,pcVar3);
  }
  return;
}

Assistant:

virtual int sync()
    {
        // Check if there is something into the write buffer
        if (pbase() != pptr())
        {
            // Print the contents of the write buffer into the standard error output
            std::size_t size = static_cast<std::size_t>(pptr() - pbase());
            fwrite(pbase(), 1, size, stderr);

            // Reset the pointer position to the beginning of the write buffer
            setp(pbase(), epptr());
        }

        return 0;
    }